

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O0

void __thiscall
QFunctionJAOHTree::SetPU(QFunctionJAOHTree *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  QFunctionForDecPOMDP *in_RSI;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_RDI;
  
  DeInitialize((QFunctionJAOHTree *)in_RSI);
  QFunctionForDecPOMDP::SetPU(in_RSI,in_RDI);
  return;
}

Assistant:

void QFunctionJAOHTree::SetPU(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu)
{
    DeInitialize();
    QFunctionJAOH::SetPU(pu);
}